

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Stress::(anonymous_namespace)::BlendingCase::genVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 300 es\nin highp vec4 a_pos;\nvoid main ()\n{\n\tgl_Position = a_pos;\n}\n",
             &local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string BlendingCase::genVertexSource (void) const
{
	return
		"#version 300 es\n"
		"in highp vec4 a_pos;\n"
		"void main ()\n"
		"{\n"
		"	gl_Position = a_pos;\n"
		"}\n";
}